

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O3

void __thiscall
rengine::SDLBackend::sendPointerEvent(SDLBackend *this,SDL_Event *sdlEvent,Type type)

{
  Uint32 UVar1;
  undefined4 extraout_XMM0_Db;
  undefined **local_78;
  Type local_70;
  float local_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  int local_30;
  undefined1 local_2c [4];
  int dw;
  int dh;
  int ww;
  int wh;
  
  if (this->m_window == (SDL_Window *)0x0) {
    __assert_fail("m_window",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x98,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
  }
  UVar1 = SDL_GetWindowID();
  if (UVar1 != (sdlEvent->display).display) {
    __assert_fail("SDL_GetWindowID(m_window) == sdlEvent->button.windowID",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x99,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
  }
  if (this->m_surface == (Surface *)0x0) {
    __assert_fail("m_surface",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x9a,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
  }
  local_78 = &PTR__Event_001367c0;
  local_70 = type;
  if (type - PointerDown < 3) {
    local_48 = (float)(sdlEvent->window).data2;
    local_58 = ZEXT416((uint)(float)(sdlEvent->motion).y);
    uStack_44 = extraout_XMM0_Db;
    SDL_GetWindowSize(this->m_window,&dw,&dh);
    SDL_GL_GetDrawableSize(this->m_window,&local_30,local_2c);
    fStack_68 = (float)((long)local_30 / (long)dw & 0xffffffff);
    local_6c = local_48 * fStack_68;
    fStack_68 = (float)local_58._0_4_ * fStack_68;
    fStack_64 = local_6c;
    fStack_60 = fStack_68;
    (*this->m_surface->_vptr_Surface[3])
              (this->m_surface,&local_78,(long)local_30 % (long)dw & 0xffffffff);
    return;
  }
  __assert_fail("t == PointerUp || t == PointerDown || t == PointerMove",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/windowsystem/event.h"
                ,0x37,"rengine::PointerEvent::PointerEvent(Type)");
}

Assistant:

inline void SDLBackend::sendPointerEvent(SDL_Event *sdlEvent, Event::Type type)
{
    assert(m_window);
    assert(SDL_GetWindowID(m_window) == sdlEvent->button.windowID);
    assert(m_surface);

    PointerEvent pe(type);
    pe.initialize(vec2(sdlEvent->button.x, sdlEvent->button.y) * devicePixelRatio());
    m_surface->onEvent(&pe);
}